

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# braille.hpp
# Opt level: O2

BrailleCanvas * __thiscall
plot::BrailleCanvas::dot(BrailleCanvas *this,Color *color,Point p,TerminalOp op)

{
  ulong uVar1;
  ulong uVar2;
  block_t local_20;
  
  uVar1 = p.y;
  uVar2 = p.x;
  if ((((-1 < (long)uVar2) && ((long)uVar2 < (long)(this->cols_ * 2))) && (-1 < (long)uVar1)) &&
     ((long)uVar1 < (long)(this->lines_ * 4))) {
    local_20.color.r = color->r;
    local_20.color.g = color->g;
    local_20.color.b = color->b;
    local_20.color.a = color->a;
    local_20.pixels =
         *(uint8_t *)
          ((long)&detail::braille::pixel_codes + (ulong)((uint)p.y & 3) + (ulong)((uint)p.x & 1) * 4
          );
    paint(this,uVar1 >> 2,uVar2 >> 1,&local_20,op);
  }
  return this;
}

Assistant:

BrailleCanvas& dot(Color const& color, Point p, TerminalOp op = TerminalOp::Over) {
        if (Rect({}, size()).contains(p)) {
            paint(p.y / cell_rows, p.x / cell_cols, detail::braille::block_t(color).set(p.x % cell_cols, p.y % cell_rows), op);
        }
        return *this;
    }